

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O3

QRect __thiscall QAccessibleDockWidget::rect(QAccessibleDockWidget *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QWidgetData *pQVar6;
  undefined1 auVar7 [12];
  long lVar8;
  QWidget *pQVar9;
  QPoint QVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  QRect QVar12;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  bVar1 = *(byte *)(*(long *)(lVar8 + 0x20) + 0xc);
  pQVar9 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  if ((bVar1 & 1) == 0) {
    pQVar6 = pQVar9->data;
    iVar2 = (pQVar6->crect).x2.m_i;
    iVar3 = (pQVar6->crect).x1.m_i;
    iVar4 = (pQVar6->crect).y2.m_i;
    iVar5 = (pQVar6->crect).y1.m_i;
    pQVar9 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    local_30.xp.m_i = 0;
    local_30.yp.m_i = 0;
    QVar10 = QWidget::mapToGlobal(pQVar9,&local_30);
    auVar7._8_4_ = QVar10.xp.m_i.m_i + (iVar2 - iVar3);
    auVar7._0_4_ = QVar10.xp.m_i;
    auVar7._4_4_ = QVar10.yp.m_i;
    uVar11 = (ulong)(uint)(QVar10.yp.m_i.m_i + (iVar4 - iVar5));
  }
  else {
    QVar12 = QWidget::frameGeometry(pQVar9);
    auVar7 = QVar12._0_12_;
    QVar10 = QVar12._0_8_;
    uVar11 = QVar12._8_8_ >> 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar12._0_8_ = (ulong)auVar7._0_4_ | (ulong)QVar10 & 0xffffffff00000000;
    QVar12._8_8_ = (ulong)auVar7._8_4_ | uVar11 << 0x20;
    return QVar12;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleDockWidget::rect() const
{
    QRect rect;

    if (dockWidget()->isFloating()) {
        rect = dockWidget()->frameGeometry();
    } else {
        rect = dockWidget()->rect();
        rect.moveTopLeft(dockWidget()->mapToGlobal(rect.topLeft()));
    }

    return rect;
}